

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Sphere::PDF(Sphere *this,ShapeSampleContext *ctx,Vector3f wi)

{
  float fVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Normal3<float> n;
  Point3<float> p2;
  Point3<float> p2_00;
  Point3<float> p1;
  Point3<float> p1_00;
  Point3<float> p1_01;
  Vector3f w;
  Point3<float> p;
  undefined1 uVar5;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar6;
  ShapeIntersection *pSVar7;
  ShapeSampleContext *in_RDI;
  float fVar8;
  type tVar11;
  float fVar9;
  Float FVar10;
  undefined8 uVar16;
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [56];
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Point3<float> PVar18;
  Point3f PVar19;
  Vector3<float> VVar20;
  Float oneMinusCosThetaMax;
  Float cosThetaMax;
  Float sin2ThetaMax;
  Float pdf;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Point3f pOrigin;
  Point3f pCenter;
  float in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  float in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  float in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  float in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  float local_254;
  float in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb4;
  optional local_240 [252];
  Float in_stack_fffffffffffffebc;
  Ray *in_stack_fffffffffffffec0;
  Sphere *this_00;
  float local_4;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  this_00 = (Sphere *)vmovlpd_avx(in_ZMM0._0_16_);
  fVar1 = (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.x;
  uVar2 = (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.y;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08,0.0);
  auVar17 = ZEXT856(0);
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)in_stack_fffffffffffffdb4;
  p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffdb4 >> 0x20);
  p.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffdb0;
  PVar18 = Transform::operator()
                     ((Transform *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),p);
  auVar12._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar12._8_56_ = auVar17;
  vmovlpd_avx(auVar12._0_16_);
  auVar17 = ZEXT856(0);
  PVar19.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcac;
  PVar19.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffca8;
  PVar19.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffcb0;
  PVar19 = ShapeSampleContext::OffsetRayOrigin((ShapeSampleContext *)CONCAT44(uVar2,fVar1),PVar19);
  auVar13._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar17;
  vmovlpd_avx(auVar13._0_16_);
  p1.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = in_stack_fffffffffffffc8f;
  p1.super_Tuple3<pbrt::Point3,_float>._0_7_ = in_stack_fffffffffffffc88;
  p1.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
  PVar18.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffc6c;
  PVar18.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc68;
  PVar18.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc70;
  fVar8 = DistanceSquared<float>(p1,PVar18);
  fVar9 = Sqr<float>((in_RDI->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
  if (fVar9 < fVar8) {
    fVar8 = (in_RDI->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
            low;
    fVar8 = fVar8 * fVar8;
    auVar17 = (undefined1  [56])0x0;
    PVar19 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    auVar15._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar15._8_56_ = auVar17;
    vmovlpd_avx(auVar15._0_16_);
    p1_01.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = in_stack_fffffffffffffc8f;
    p1_01.super_Tuple3<pbrt::Point3,_float>._0_7_ = in_stack_fffffffffffffc88;
    p1_01.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
    p2_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffc6c;
    p2_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc68;
    p2_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc70;
    fVar9 = DistanceSquared<float>(p1_01,p2_00);
    fVar1 = SafeSqrt(0.0);
    fVar1 = 1.0 - fVar1;
    if (fVar8 / fVar9 < 0.00068523) {
      fVar1 = (fVar8 / fVar9) / 2.0;
    }
    local_4 = 1.0 / (fVar1 * 6.2831855);
  }
  else {
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffcb4;
    w.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffcb0;
    w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffcb8;
    ShapeSampleContext::SpawnRay(in_RDI,w);
    Intersect(this_00,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    uVar5 = pstd::optional::operator_cast_to_bool(local_240);
    if ((bool)uVar5) {
      FVar10 = Area((Sphere *)in_RDI);
      local_254 = 1.0 / FVar10;
      uVar16 = 0;
      pSVar7 = pstd::optional<pbrt::ShapeIntersection>::operator->
                         ((optional<pbrt::ShapeIntersection> *)0x8e1154);
      fVar9 = SUB84(pSVar7,0);
      VVar20 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      fVar8 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._8_8_ = uVar16;
      auVar4._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar4);
      n.super_Tuple3<pbrt::Normal3,_float>.y = local_254;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffc68;
      n.super_Tuple3<pbrt::Normal3,_float>.z = fVar9;
      VVar20.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffc50;
      VVar20.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc4c;
      VVar20.super_Tuple3<pbrt::Vector3,_float>.z = fVar8;
      tVar11 = AbsDot<float>(n,VVar20);
      auVar17 = extraout_var;
      PVar19 = ShapeSampleContext::p((ShapeSampleContext *)CONCAT44(fVar8,tVar11));
      auVar14._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar14._8_56_ = auVar17;
      uVar16 = 0;
      vmovlpd_avx(auVar14._0_16_);
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x8e129e);
      PVar19 = Interaction::p((Interaction *)CONCAT44(fVar8,tVar11));
      auVar3._8_8_ = uVar16;
      auVar3._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
      vmovlpd_avx(auVar3);
      p1_00.super_Tuple3<pbrt::Point3,_float>.y._3_1_ = uVar5;
      p1_00.super_Tuple3<pbrt::Point3,_float>._0_7_ = in_stack_fffffffffffffc88;
      p1_00.super_Tuple3<pbrt::Point3,_float>.z = fVar1;
      p2.super_Tuple3<pbrt::Point3,_float>.y = local_254;
      p2.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc68;
      p2.super_Tuple3<pbrt::Point3,_float>.z = fVar9;
      fVar1 = DistanceSquared<float>(p1_00,p2);
      local_254 = local_254 / (tVar11 / fVar1);
      eVar6 = IsInf<float>(0.0);
      if (eVar6) {
        local_254 = 0.0;
      }
      local_4 = local_254;
    }
    else {
      local_4 = 0.0;
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x8e13de);
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        Point3f pCenter = (*renderFromObject)(Point3f(0, 0, 0));
        Point3f pOrigin = ctx.OffsetRayOrigin(pCenter);
        if (DistanceSquared(pOrigin, pCenter) <= Sqr(radius)) {
            // Return solid angle PDF for point inside sphere
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }
        // Compute general solid angle sphere PDF
        Float sin2ThetaMax = radius * radius / DistanceSquared(ctx.p(), pCenter);
        Float cosThetaMax = SafeSqrt(1 - sin2ThetaMax);
        Float oneMinusCosThetaMax = 1 - cosThetaMax;
        // Compute more accurate _oneMinusCosThetaMax_ for small solid angle
        if (sin2ThetaMax < 0.00068523f /* sin^2(1.5 deg) */)
            oneMinusCosThetaMax = sin2ThetaMax / 2;

        return 1 / (2 * Pi * oneMinusCosThetaMax);
    }